

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BFTraceReader.cpp
# Opt level: O0

void __thiscall BFTraceReader::loadCFGs(BFTraceReader *this)

{
  Addr AVar1;
  bool bVar2;
  Type TVar3;
  Symbol *pSVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  reference ppSVar7;
  reference puVar8;
  CFG *pCVar9;
  reference puVar10;
  BlockData *pBVar11;
  CfgNode *pCVar12;
  iterator __first;
  pair<std::_Rb_tree_const_iterator<unsigned_long>,_bool> pVar13;
  _Self local_1f0;
  Addr local_1e8;
  Addr dst_1;
  iterator __end4;
  iterator __begin4;
  mapped_type *__range4;
  CfgNode *exit;
  CfgNode *entry_1;
  CfgNode *node;
  BasicBlock *bb_1;
  _Self local_1a0;
  CFG *local_198;
  Addr addr;
  iterator ed;
  iterator it;
  list<unsigned_long,_std::allocator<unsigned_long>_> nodes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148 [32];
  CFG *local_128;
  CFG *cfg;
  Addr entry;
  iterator __end2;
  iterator __begin2;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *__range2;
  Symbol *sym_1;
  iterator __end1;
  iterator __begin1;
  list<BFTraceReader::Symbol_*,_std::allocator<BFTraceReader::Symbol_*>_> *__range1;
  anon_union_8_3_0f55d3ce_for_data local_d0;
  Addr dst;
  Addr src;
  _Rb_tree_const_iterator<unsigned_long> _Stack_b8;
  bool is_exit;
  undefined1 local_b0;
  byte local_a1;
  string local_a0 [7];
  bool is_entry;
  string term_type;
  int local_80;
  Addr bb_end;
  BasicBlock *bb;
  Addr bb_addr;
  Addr faddr;
  string local_50 [8];
  string keyword;
  undefined1 local_30 [8];
  list<BFTraceReader::Symbol_*,_std::allocator<BFTraceReader::Symbol_*>_> symbols;
  Symbol *sym;
  BFTraceReader *this_local;
  
  symbols.super__List_base<BFTraceReader::Symbol_*,_std::allocator<BFTraceReader::Symbol_*>_>.
  _M_impl._M_node._M_size = 0;
  std::__cxx11::list<BFTraceReader::Symbol_*,_std::allocator<BFTraceReader::Symbol_*>_>::list
            ((list<BFTraceReader::Symbol_*,_std::allocator<BFTraceReader::Symbol_*>_> *)local_30);
  do {
    if ((this->m_current).type != TKN_KEYWORD) {
      matchToken(this,TKN_EOF);
      __end1 = std::__cxx11::list<BFTraceReader::Symbol_*,_std::allocator<BFTraceReader::Symbol_*>_>
               ::begin((list<BFTraceReader::Symbol_*,_std::allocator<BFTraceReader::Symbol_*>_> *)
                       local_30);
      sym_1 = (Symbol *)
              std::__cxx11::list<BFTraceReader::Symbol_*,_std::allocator<BFTraceReader::Symbol_*>_>
              ::end((list<BFTraceReader::Symbol_*,_std::allocator<BFTraceReader::Symbol_*>_> *)
                    local_30);
      do {
        bVar2 = std::operator!=(&__end1,(_Self *)&sym_1);
        if (!bVar2) {
          std::__cxx11::list<BFTraceReader::Symbol_*,_std::allocator<BFTraceReader::Symbol_*>_>::
          ~list((list<BFTraceReader::Symbol_*,_std::allocator<BFTraceReader::Symbol_*>_> *)local_30)
          ;
          return;
        }
        ppSVar7 = std::_List_iterator<BFTraceReader::Symbol_*>::operator*(&__end1);
        pSVar4 = *ppSVar7;
        __end2 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                 begin(&pSVar4->entries);
        entry = (Addr)std::
                      set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                      end(&pSVar4->entries);
        while (bVar2 = std::operator!=(&__end2,(_Self *)&entry), bVar2) {
          puVar8 = std::_Rb_tree_const_iterator<unsigned_long>::operator*(&__end2);
          cfg = (CFG *)*puVar8;
          pCVar9 = CFGReader::instance(&this->super_CFGReader,(Addr)cfg);
          local_128 = pCVar9;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &nodes.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl._M_node._M_size,(char *)&pSVar4->filename);
          std::operator+(local_148,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &nodes.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl._M_node._M_size);
          CFG::setFunctionName(pCVar9,local_148);
          std::__cxx11::string::~string((string *)local_148);
          std::__cxx11::string::~string
                    ((string *)
                     &nodes.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      _M_node._M_size);
          std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::list
                    ((list<unsigned_long,_std::allocator<unsigned_long>_> *)&it);
          std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    ((list<unsigned_long,_std::allocator<unsigned_long>_> *)&it,
                     (value_type_conflict *)&cfg);
          ed = std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::begin
                         ((list<unsigned_long,_std::allocator<unsigned_long>_> *)&it);
          addr = (Addr)std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::end
                                 ((list<unsigned_long,_std::allocator<unsigned_long>_> *)&it);
          while (bVar2 = std::operator!=(&ed,(_Self *)&addr), bVar2) {
            puVar10 = std::_List_iterator<unsigned_long>::operator*(&ed);
            local_198 = (CFG *)*puVar10;
            if (local_198 == (CFG *)0x0) {
              __assert_fail("addr != 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/BFTraceReader.cpp"
                            ,0x8a,"virtual void BFTraceReader::loadCFGs()");
            }
            local_1a0._M_node =
                 (_Base_ptr)
                 std::
                 map<unsigned_long,_BFTraceReader::BasicBlock,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_BFTraceReader::BasicBlock>_>_>
                 ::find(&pSVar4->blocks,(key_type *)&local_198);
            bb_1 = (BasicBlock *)
                   std::
                   map<unsigned_long,_BFTraceReader::BasicBlock,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_BFTraceReader::BasicBlock>_>_>
                   ::end(&pSVar4->blocks);
            bVar2 = std::operator!=(&local_1a0,(_Self *)&bb_1);
            if (!bVar2) {
              __assert_fail("sym->blocks.find(addr) != sym->blocks.end()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/BFTraceReader.cpp"
                            ,0x8c,"virtual void BFTraceReader::loadCFGs()");
            }
            pmVar5 = std::
                     map<unsigned_long,_BFTraceReader::BasicBlock,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_BFTraceReader::BasicBlock>_>_>
                     ::operator[](&pSVar4->blocks,(key_type *)&local_198);
            entry_1 = CFG::nodeByAddr(local_128,(Addr)local_198);
            if (entry_1 == (CfgNode *)0x0) {
              entry_1 = (CfgNode *)operator_new(0x18);
              CfgNode::CfgNode(entry_1,CFG_BLOCK);
              pBVar11 = (BlockData *)operator_new(0x90);
              CfgNode::BlockData::BlockData(pBVar11,(Addr)local_198,pmVar5->size,false);
              CfgNode::setData(entry_1,(Data *)pBVar11);
              CFG::addNode(local_128,entry_1);
            }
            else {
              TVar3 = CfgNode::type(entry_1);
              if (TVar3 != CFG_PHANTOM) {
                __assert_fail("node->type() == CfgNode::CFG_PHANTOM",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/BFTraceReader.cpp"
                              ,0x95,"virtual void BFTraceReader::loadCFGs()");
              }
              pBVar11 = (BlockData *)operator_new(0x90);
              CfgNode::BlockData::BlockData(pBVar11,(Addr)local_198,pmVar5->size,false);
              CfgNode::setData(entry_1,(Data *)pBVar11);
            }
            if (local_198 == cfg) {
              pCVar12 = CFG::entryNode(local_128);
              if (pCVar12 != (CfgNode *)0x0) {
                __assert_fail("cfg->entryNode() == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/BFTraceReader.cpp"
                              ,0x9a,"virtual void BFTraceReader::loadCFGs()");
              }
              pCVar12 = CFGReader::entryNode(local_128);
              CFG::addEdge(local_128,pCVar12,entry_1,0);
            }
            if (((pmVar5->is_exit & 1U) != 0) || (pmVar5->type == RETURN)) {
              pCVar12 = CFGReader::exitNode(local_128);
              CFG::addEdge(local_128,entry_1,pCVar12,0);
            }
            pmVar6 = std::
                     map<unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
                     ::operator[](&pSVar4->edges,(key_type *)&local_198);
            __end4 = std::
                     set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                     begin(pmVar6);
            dst_1 = (Addr)std::
                          set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                          ::end(pmVar6);
            while (bVar2 = std::operator!=(&__end4,(_Self *)&dst_1), bVar2) {
              puVar8 = std::_Rb_tree_const_iterator<unsigned_long>::operator*(&__end4);
              pCVar9 = local_128;
              local_1e8 = *puVar8;
              pCVar12 = CFGReader::nodeWithAddr(local_128,local_1e8);
              CFG::addEdge(pCVar9,entry_1,pCVar12,0);
              __first = std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::begin
                                  ((list<unsigned_long,_std::allocator<unsigned_long>_> *)&it);
              local_1f0._M_node =
                   (_List_node_base *)
                   std::find<std::_List_iterator<unsigned_long>,unsigned_long>
                             (__first._M_node,(_List_iterator<unsigned_long>)addr,&local_1e8);
              bVar2 = std::operator==(&local_1f0,(_Self *)&addr);
              if (bVar2) {
                std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                          ((list<unsigned_long,_std::allocator<unsigned_long>_> *)&it,&local_1e8);
              }
              std::_Rb_tree_const_iterator<unsigned_long>::operator++(&__end4);
            }
            std::_List_iterator<unsigned_long>::operator++(&ed);
          }
          CFG::check(local_128);
          std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::~list
                    ((list<unsigned_long,_std::allocator<unsigned_long>_> *)&it);
          std::_Rb_tree_const_iterator<unsigned_long>::operator++(&__end2);
        }
        if (pSVar4 != (Symbol *)0x0) {
          Symbol::~Symbol(pSVar4);
          operator_delete(pSVar4);
        }
        std::_List_iterator<BFTraceReader::Symbol_*>::operator++(&__end1);
      } while( true );
    }
    std::__cxx11::string::string(local_50,(string *)&(this->m_current).token);
    matchToken(this,TKN_KEYWORD);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_50,"symbol");
    if (bVar2) {
      pSVar4 = (Symbol *)operator_new(0xe8);
      (pSVar4->entries)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
      (pSVar4->entries)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      *(undefined8 *)&(pSVar4->entries)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
      (pSVar4->entries)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      (pSVar4->edges)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      *(undefined8 *)&(pSVar4->entries)._M_t._M_impl = 0;
      (pSVar4->edges)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
      (pSVar4->edges)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      *(undefined8 *)&(pSVar4->edges)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
      (pSVar4->edges)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      (pSVar4->blocks)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      *(undefined8 *)&(pSVar4->edges)._M_t._M_impl = 0;
      (pSVar4->blocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
      (pSVar4->blocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      *(undefined8 *)&(pSVar4->blocks)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
      (pSVar4->blocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      pSVar4->bias = 0;
      *(undefined8 *)&(pSVar4->blocks)._M_t._M_impl = 0;
      *(undefined8 *)&pSVar4->field_0x40 = 0;
      *(undefined8 *)&pSVar4->field_0x48 = 0;
      *(undefined8 *)&pSVar4->functname = 0;
      *(undefined8 *)&pSVar4->field_0x38 = 0;
      *(undefined8 *)&pSVar4->field_0x20 = 0;
      *(undefined8 *)&pSVar4->field_0x28 = 0;
      *(undefined8 *)&pSVar4->filename = 0;
      *(undefined8 *)&pSVar4->field_0x18 = 0;
      pSVar4->start = 0;
      pSVar4->end = 0;
      (pSVar4->entries)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      Symbol::Symbol(pSVar4);
      symbols.super__List_base<BFTraceReader::Symbol_*,_std::allocator<BFTraceReader::Symbol_*>_>.
      _M_impl._M_node._M_size = (size_t)pSVar4;
      std::__cxx11::list<BFTraceReader::Symbol_*,_std::allocator<BFTraceReader::Symbol_*>_>::
      push_back((list<BFTraceReader::Symbol_*,_std::allocator<BFTraceReader::Symbol_*>_> *)local_30,
                (value_type *)
                &symbols.
                 super__List_base<BFTraceReader::Symbol_*,_std::allocator<BFTraceReader::Symbol_*>_>
                 ._M_impl._M_node._M_size);
      *(anon_union_8_3_0f55d3ce_for_data *)
       symbols.super__List_base<BFTraceReader::Symbol_*,_std::allocator<BFTraceReader::Symbol_*>_>.
       _M_impl._M_node._M_size = (this->m_current).data;
      matchToken(this,TKN_ADDR);
      *(anon_union_8_3_0f55d3ce_for_data *)
       (symbols.super__List_base<BFTraceReader::Symbol_*,_std::allocator<BFTraceReader::Symbol_*>_>.
        _M_impl._M_node._M_size + 8) = (this->m_current).data;
      matchToken(this,TKN_ADDR);
      std::__cxx11::string::operator=
                ((string *)
                 (symbols.
                  super__List_base<BFTraceReader::Symbol_*,_std::allocator<BFTraceReader::Symbol_*>_>
                  ._M_impl._M_node._M_size + 0x10),(string *)&(this->m_current).token);
      matchToken(this,TKN_STRING);
      std::__cxx11::string::operator=
                ((string *)
                 (symbols.
                  super__List_base<BFTraceReader::Symbol_*,_std::allocator<BFTraceReader::Symbol_*>_>
                  ._M_impl._M_node._M_size + 0x30),(string *)&(this->m_current).token);
      matchToken(this,TKN_STRING);
      *(anon_union_8_3_0f55d3ce_for_data *)
       (symbols.super__List_base<BFTraceReader::Symbol_*,_std::allocator<BFTraceReader::Symbol_*>_>.
        _M_impl._M_node._M_size + 0x50) = (this->m_current).data;
      matchToken(this,TKN_ADDR);
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_50,"program-entry");
      if (bVar2) {
        symbols.super__List_base<BFTraceReader::Symbol_*,_std::allocator<BFTraceReader::Symbol_*>_>.
        _M_impl._M_node._M_size = 0;
        matchToken(this,TKN_ADDR);
        matchToken(this,TKN_ADDR);
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_50,"block");
        if (bVar2) {
          if (symbols.
              super__List_base<BFTraceReader::Symbol_*,_std::allocator<BFTraceReader::Symbol_*>_>.
              _M_impl._M_node._M_size == 0) {
            __assert_fail("sym != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/BFTraceReader.cpp"
                          ,0x44,"virtual void BFTraceReader::loadCFGs()");
          }
          bb_addr = (this->m_current).data.addr;
          matchToken(this,TKN_ADDR);
          if (bb_addr !=
              *(Addr *)symbols.
                       super__List_base<BFTraceReader::Symbol_*,_std::allocator<BFTraceReader::Symbol_*>_>
                       ._M_impl._M_node._M_size) {
            __assert_fail("faddr == sym->start",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/BFTraceReader.cpp"
                          ,0x48,"virtual void BFTraceReader::loadCFGs()");
          }
          bb = *(BasicBlock **)&(this->m_current).data;
          matchToken(this,TKN_ADDR);
          pmVar5 = std::
                   map<unsigned_long,_BFTraceReader::BasicBlock,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_BFTraceReader::BasicBlock>_>_>
                   ::operator[]((map<unsigned_long,_BFTraceReader::BasicBlock,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_BFTraceReader::BasicBlock>_>_>
                                 *)(symbols.
                                    super__List_base<BFTraceReader::Symbol_*,_std::allocator<BFTraceReader::Symbol_*>_>
                                    ._M_impl._M_node._M_size + 0x58),(key_type *)&bb);
          AVar1 = (this->m_current).data.addr;
          matchToken(this,TKN_ADDR);
          local_80 = (int)AVar1;
          pmVar5->size = local_80 - (int)bb;
          matchToken(this,TKN_ADDR);
          std::__cxx11::string::string(local_a0,(string *)&(this->m_current).token);
          matchToken(this,TKN_KEYWORD);
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_a0,"jump");
          if (bVar2) {
            pmVar5->type = JUMP;
          }
          else {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_a0,"call");
            if (bVar2) {
              pmVar5->type = CALL;
            }
            else {
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_a0,"return");
              if (bVar2) {
                pmVar5->type = RETURN;
              }
              else {
                bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_a0,"other");
                if (!bVar2) {
                  __assert_fail("term_type == \"other\"",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/BFTraceReader.cpp"
                                ,0x5d,"virtual void BFTraceReader::loadCFGs()");
                }
                pmVar5->type = OTHER;
              }
            }
          }
          local_a1 = (this->m_current).data.boolean & 1;
          matchToken(this,TKN_BOOL);
          if ((local_a1 & 1) != 0) {
            pVar13 = std::
                     set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                     insert((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                             *)(symbols.
                                super__List_base<BFTraceReader::Symbol_*,_std::allocator<BFTraceReader::Symbol_*>_>
                                ._M_impl._M_node._M_size + 0xb8),(value_type_conflict *)&bb);
            _Stack_b8 = pVar13.first._M_node;
            local_b0 = pVar13.second;
          }
          src._7_1_ = (this->m_current).data.boolean & 1;
          matchToken(this,TKN_BOOL);
          pmVar5->is_exit = (bool)(src._7_1_ & 1);
          std::__cxx11::string::~string(local_a0);
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_50,"call");
          if (bVar2) {
            matchToken(this,TKN_ADDR);
            matchToken(this,TKN_ADDR);
          }
          else {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_50,"return");
            if (bVar2) {
              matchToken(this,TKN_ADDR);
              matchToken(this,TKN_ADDR);
            }
            else {
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_50,"br");
              if (!bVar2) {
                __assert_fail("false",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/BFTraceReader.cpp"
                              ,0x7a,"virtual void BFTraceReader::loadCFGs()");
              }
              if (symbols.
                  super__List_base<BFTraceReader::Symbol_*,_std::allocator<BFTraceReader::Symbol_*>_>
                  ._M_impl._M_node._M_size == 0) {
                __assert_fail("sym != 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/BFTraceReader.cpp"
                              ,0x70,"virtual void BFTraceReader::loadCFGs()");
              }
              dst = (this->m_current).data.addr;
              matchToken(this,TKN_ADDR);
              local_d0 = (this->m_current).data;
              matchToken(this,TKN_ADDR);
              pmVar6 = std::
                       map<unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
                       ::operator[]((map<unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
                                     *)(symbols.
                                        super__List_base<BFTraceReader::Symbol_*,_std::allocator<BFTraceReader::Symbol_*>_>
                                        ._M_impl._M_node._M_size + 0x88),&dst);
              std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
              insert(pmVar6,&local_d0.addr);
            }
          }
        }
      }
    }
    std::__cxx11::string::~string(local_50);
  } while( true );
}

Assistant:

void BFTraceReader::loadCFGs() {
	Symbol* sym = 0;
	std::list<Symbol*> symbols;

	while (m_current.type == InputTokenizer::Lexeme::TKN_KEYWORD) {
		std::string keyword = m_current.token;
		matchToken(InputTokenizer::Lexeme::TKN_KEYWORD);

		if (keyword == "symbol") {
			sym = new Symbol();
			symbols.push_back(sym);

			sym->start = m_current.data.addr;
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);

			sym->end = m_current.data.addr;
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);

			sym->filename = m_current.token;
			matchToken(InputTokenizer::Lexeme::TKN_STRING);

			sym->functname = m_current.token;
			matchToken(InputTokenizer::Lexeme::TKN_STRING);

			sym->bias = m_current.data.addr;
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);
		} else if (keyword == "program-entry") {
			sym = 0;
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);
		} else if (keyword == "block") {
			assert(sym != 0);

			Addr faddr = m_current.data.addr;
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);
			assert(faddr == sym->start);

			Addr bb_addr = m_current.data.addr;
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);
			BasicBlock& bb = sym->blocks[bb_addr];

			Addr bb_end = m_current.data.addr;
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);
			bb.size = bb_end - bb_addr;

			matchToken(InputTokenizer::Lexeme::TKN_ADDR);

			std::string term_type = m_current.token;
			matchToken(InputTokenizer::Lexeme::TKN_KEYWORD);
			if (term_type == "jump")
				bb.type = BFTraceReader::JUMP;
			else if (term_type == "call")
				bb.type = BFTraceReader::CALL;
			else if (term_type == "return")
				bb.type = BFTraceReader::RETURN;
			else {
				assert(term_type == "other");
				bb.type = BFTraceReader::OTHER;
			}

			bool is_entry = m_current.data.boolean;
			matchToken(InputTokenizer::Lexeme::TKN_BOOL);
			if (is_entry)
				sym->entries.insert(bb_addr);

			bool is_exit = m_current.data.boolean;
			matchToken(InputTokenizer::Lexeme::TKN_BOOL);
			bb.is_exit = is_exit;
		} else if (keyword == "call") {
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);
		} else if (keyword == "return") {
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);
		} else if (keyword == "br") {
			assert(sym != 0);

			Addr src = m_current.data.addr;
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);

			Addr dst = m_current.data.addr;
			matchToken(InputTokenizer::Lexeme::TKN_ADDR);

			sym->edges[src].insert(dst);
		} else {
			assert(false);
		}
	}

	matchToken(InputTokenizer::Lexeme::TKN_EOF);

	for (Symbol* sym : symbols) {
		for (Addr entry : sym->entries) {
			CFG* cfg = this->instance(entry);
			cfg->setFunctionName(sym->filename + "::" + sym->functname);

			std::list<Addr> nodes;
			nodes.push_back(entry);
			for (std::list<Addr>::iterator it = nodes.begin(), ed = nodes.end();
					it != ed; ++it) {
				Addr addr = *it;
				assert(addr != 0);

				assert(sym->blocks.find(addr) != sym->blocks.end());
				BasicBlock& bb = sym->blocks[addr];

				CfgNode* node = cfg->nodeByAddr(addr);
				if (node == 0) {
					node = new CfgNode(CfgNode::CFG_BLOCK);
					node->setData(new CfgNode::BlockData(addr, bb.size));
					cfg->addNode(node);
				} else {
					assert(node->type() == CfgNode::CFG_PHANTOM);
					node->setData(new CfgNode::BlockData(addr, bb.size));
				}

				if (addr == entry) {
					assert(cfg->entryNode() == 0);
					CfgNode* entry = CFGReader::entryNode(cfg);
					cfg->addEdge(entry, node);
				}

				if (bb.is_exit || bb.type == BFTraceReader::RETURN) {
					CfgNode* exit = CFGReader::exitNode(cfg);
					cfg->addEdge(node, exit);
				}

				for (Addr dst : sym->edges[addr]) {
					cfg->addEdge(node, CFGReader::nodeWithAddr(cfg, dst));

					if (std::find(nodes.begin(), ed, dst) == ed)
						nodes.push_back(dst);
				}
			}

			cfg->check();
		}

		delete sym;
	}
}